

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_get_region_host.cc
# Opt level: O2

string * aliyun::AliGetEndpointHost(string *__return_storage_ptr__,string *region,string *product)

{
  bool bVar1;
  long lVar2;
  int i;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar2 = *(long *)((anonymous_namespace)::regions + lVar3 * 0x10 + 8) + 8;
        *(char **)(lVar2 + -8) != (char *)0x0; lVar2 = lVar2 + 0x10) {
      bVar1 = std::operator==(*(char **)(lVar2 + -8),product);
      if (bVar1) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AliGetEndpointHost(std::string region, std::string product) {
  std::string ret;
  for(int i = 0; regions[i].region_name_ ; i++) {
    for(int j = 0; regions[i].productions[j].product_name_ ; j++) {
      if(regions[i].productions[j].product_name_ == product) {
        ret = regions[i].productions[j].domain_name_;
      }
    }
  }
  return ret;
}